

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
jessilib::make_json_string<char32_t,char32_t>
          (jessilib *this,
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *out_string,
          u8string_view in_string)

{
  char32_t in_codepoint;
  undefined8 in_RAX;
  char8_t *extraout_RDX;
  size_t sVar1;
  char8_t *extraout_RDX_00;
  char8_t *pcVar2;
  char8_t *extraout_RDX_01;
  char8_t *extraout_RDX_02;
  char *__last;
  char8_t *extraout_RDX_03;
  char8_t *__first;
  char *__first_00;
  size_t sVar3;
  decode_result dVar4;
  __integer_to_chars_result_type<unsigned_int> _Var5;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  undefined8 uStack_38;
  char data [2];
  
  sVar3 = in_string._M_len;
  uStack_38 = in_RAX;
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  reserve((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)this,
          (long)&(out_string->_M_dataplus)._M_p + *(long *)(this + 8) + 2);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  push_back((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)this,
            L'\"');
  pcVar2 = extraout_RDX;
  do {
    in_string_00._M_str = pcVar2;
    in_string_00._M_len = sVar3;
    dVar4 = decode_codepoint_utf8<char8_t>((jessilib *)out_string,in_string_00);
    sVar1 = dVar4.units;
    if (sVar1 == 0) {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                this,L'\"');
      return;
    }
    in_codepoint = dVar4.codepoint;
    if (in_codepoint == L'\"') {
      __first = "\\\"";
      pcVar2 = "\\\"";
LAB_0019a5e5:
      std::__cxx11::u32string::append<char8_t_const*,void>((u32string *)this,__first,pcVar2 + 2);
      pcVar2 = extraout_RDX_00;
    }
    else {
      if (in_codepoint == L'\\') {
        __first = "\\\\";
        pcVar2 = "\\\\";
        goto LAB_0019a5e5;
      }
      if ((uint)in_codepoint < 0x20) {
        std::__cxx11::u32string::append<char8_t_const*,void>((u32string *)this,"\\u00","");
        __last = &stack0xffffffffffffffd0;
        _Var5 = std::__to_chars_i<unsigned_int>(data,__last,in_codepoint,0x10);
        if (_Var5.ptr == data) {
          __first_00 = "00";
          __last = "";
        }
        else {
          if (_Var5.ptr != __last) {
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                      ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)this,L'0');
            simple_append<char32_t,char32_t>
                      ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                        *)this,data[0]);
            pcVar2 = extraout_RDX_01;
            goto LAB_0019a5ea;
          }
          __first_00 = data;
        }
        std::__cxx11::u32string::append<char8_t_const*,void>((u32string *)this,__first_00,__last);
        pcVar2 = extraout_RDX_03;
      }
      else {
        encode_codepoint_utf32<char32_t,std::__cxx11::u32string>
                  ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                   this,in_codepoint);
        pcVar2 = extraout_RDX_02;
      }
    }
LAB_0019a5ea:
    sVar3 = sVar3 + sVar1;
    out_string = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 ((long)out_string - sVar1);
  } while( true );
}

Assistant:

void make_json_string(std::basic_string<ResultCharT>& out_string, std::u8string_view in_string) {
	using namespace std::literals;
	out_string.reserve(out_string.size() + in_string.size() + 2);
	simple_append<CharT, ResultCharT>(out_string, '\"');

	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		if (decode.codepoint == U'\\') { // backslash
			simple_append<CharT, ResultCharT>(out_string, u8"\\\\"sv);
		}
		else if (decode.codepoint == U'\"') { // quotation
			simple_append<CharT, ResultCharT>(out_string, u8"\\\""sv);
		}
		else if (decode.codepoint < 0x20) { // control characters
			simple_append<CharT, ResultCharT>(out_string, u8"\\u00"sv);

			// overwrite last 2 zeroes with correct hexadecimal sequence
			char data[2]; // Will only ever use 2 chars
			char* data_end = data + sizeof(data);
			auto to_chars_result = std::to_chars(data, data_end, static_cast<uint32_t>(decode.codepoint), 16);
			if (to_chars_result.ptr == data) {
				// No bytes written
				simple_append<CharT, ResultCharT>(out_string, u8"00"sv);
			}
			else if (to_chars_result.ptr != data_end) {
				// 1 byte written
				simple_append<CharT, ResultCharT>(out_string, '0');
				simple_append<CharT, ResultCharT>(out_string, data[0]);
			}
			else {
				// 2 bytes written
				simple_append<CharT, ResultCharT>(out_string, std::u8string_view{ reinterpret_cast<char8_t*>(data), sizeof(data) });
			}
		}
		else {
			if constexpr (sizeof(CharT) == sizeof(char8_t) && sizeof(CharT) == sizeof(ResultCharT)) {
				// Valid UTF-8 sequence; copy it over
				out_string.append(reinterpret_cast<const ResultCharT*>(in_string.data()), decode.units);
			}
			else if constexpr (sizeof(CharT) == sizeof(ResultCharT)){
				// Valid UTF-8 codepoint; append it
				encode_codepoint(out_string, decode.codepoint);
			}
			else {
				// Valid UTF-8 codepoint; encode & append it
				encode_buffer_type<CharT> buffer;
				size_t units_written = encode_codepoint(buffer, decode.codepoint);
				out_string.append(reinterpret_cast<ResultCharT*>(buffer), units_written * sizeof(CharT));
			}
		}

		in_string.remove_prefix(decode.units);
	}

	simple_append<CharT, ResultCharT>(out_string, '\"');
}